

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O1

bool embree::sse42::InstanceArrayIntersector1MB::occluded
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  Vec3ff *pVVar1;
  ulong uVar2;
  undefined8 uVar3;
  int iVar4;
  Geometry *pGVar5;
  RTCRayQueryContext *pRVar6;
  long *plVar7;
  long lVar8;
  undefined1 auVar9 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar10;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar11;
  bool bVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  _func_int *p_Var18;
  undefined1 auVar19 [12];
  undefined1 in_XMM0 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  float fVar26;
  float fVar29;
  undefined1 in_XMM1 [16];
  vfloat4 a0;
  undefined1 auVar28 [16];
  undefined1 auVar30 [12];
  float fVar34;
  undefined1 in_XMM2 [16];
  undefined1 auVar31 [16];
  float fVar35;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 in_XMM3 [16];
  vfloat4 l02;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar43;
  undefined1 auVar44 [16];
  float fVar45;
  undefined1 auVar46 [12];
  undefined1 in_XMM5 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar51;
  undefined1 in_XMM6 [16];
  undefined1 auVar50 [16];
  float fVar52;
  undefined1 auVar55 [12];
  float fVar53;
  float fVar54;
  float fVar61;
  undefined1 in_XMM7 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar62;
  undefined1 auVar60 [16];
  float fVar63;
  undefined1 in_XMM8 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar66;
  float fVar67;
  undefined1 in_XMM9 [16];
  undefined1 auVar68 [16];
  float fVar69;
  undefined1 in_XMM10 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  undefined1 in_XMM14 [16];
  vfloat4 a0_1;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar89;
  float fVar90;
  RayQueryContext newcontext;
  undefined1 local_198 [8];
  undefined8 uStack_190;
  undefined1 local_188 [8];
  undefined8 uStack_180;
  undefined1 local_168 [8];
  float fStack_160;
  float fStack_15c;
  undefined1 local_158 [8];
  float fStack_150;
  float fStack_14c;
  float local_148;
  float local_c8;
  float local_78;
  float fStack_74;
  float fStack_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  undefined1 auVar27 [16];
  
  auVar55 = in_XMM7._0_12_;
  auVar46 = in_XMM5._0_12_;
  uVar15 = prim->primID_;
  pGVar5 = (context->scene->geometries).items[prim->instID_].ptr;
  p_Var18 = *(_func_int **)&pGVar5->field_0x58;
  if (p_Var18 == (_func_int *)0x0) {
    uVar13 = (ulong)*(uint *)(*(long *)&pGVar5[1].time_range.upper +
                             (long)pGVar5[1].intersectionFilterN * (ulong)uVar15);
    if (uVar13 == 0xffffffff) {
      p_Var18 = (_func_int *)0x0;
    }
    else {
      p_Var18 = pGVar5[1].super_RefCount._vptr_RefCount[uVar13];
    }
  }
  if (((p_Var18 == (_func_int *)0x0) || ((ray->mask & pGVar5->mask) == 0)) ||
     (pRVar6 = context->user, pRVar6->instID[0] != 0xffffffff)) {
    bVar12 = false;
  }
  else {
    pRVar6->instID[0] = prim->instID_;
    pRVar6->instPrimID[0] = uVar15;
    uVar13 = (ulong)prim->primID_;
    if (pGVar5->numTimeSteps == 1) {
      plVar7 = *(long **)&pGVar5[1].fnumTimeSegments;
      iVar4 = (int)plVar7[4];
      if ((pGVar5->field_8).field_0x1 == '\x01') {
        if (iVar4 == 0x9134) {
          lVar8 = *plVar7;
          lVar14 = uVar13 * plVar7[2];
          auVar23 = insertps(ZEXT416(*(uint *)(lVar8 + lVar14)),
                             *(undefined4 *)(lVar8 + 0x10 + lVar14),0x1c);
          in_XMM10 = insertps(auVar23,*(undefined4 *)(lVar8 + 0x20 + lVar14),0x28);
          auVar23 = insertps(ZEXT416(*(uint *)(lVar8 + 4 + lVar14)),
                             *(undefined4 *)(lVar8 + 0x14 + lVar14),0x1c);
          in_XMM4 = insertps(auVar23,*(undefined4 *)(lVar8 + 0x24 + lVar14),0x28);
          auVar23 = insertps(ZEXT416(*(uint *)(lVar8 + 8 + lVar14)),
                             *(undefined4 *)(lVar8 + 0x18 + lVar14),0x1c);
          in_XMM3 = insertps(auVar23,*(undefined4 *)(lVar8 + 0x28 + lVar14),0x28);
          auVar23 = insertps(ZEXT416(*(uint *)(lVar8 + 0xc + lVar14)),
                             *(undefined4 *)(lVar8 + 0x1c + lVar14),0x1c);
          in_XMM2 = insertps(auVar23,*(undefined4 *)(lVar8 + 0x2c + lVar14),0x28);
        }
        else if (iVar4 == 0x9234) {
          lVar8 = *plVar7;
          lVar14 = uVar13 * plVar7[2];
          uVar3 = *(undefined8 *)(lVar8 + 4 + lVar14);
          in_XMM10._4_4_ = (int)uVar3;
          in_XMM10._0_4_ = *(undefined4 *)(lVar8 + lVar14);
          in_XMM10._8_4_ = (int)((ulong)uVar3 >> 0x20);
          in_XMM10._12_4_ = 0;
          uVar3 = *(undefined8 *)(lVar8 + 0x10 + lVar14);
          in_XMM4._4_4_ = (int)uVar3;
          in_XMM4._0_4_ = *(undefined4 *)(lVar8 + 0xc + lVar14);
          in_XMM4._8_4_ = (int)((ulong)uVar3 >> 0x20);
          in_XMM4._12_4_ = 0;
          uVar3 = *(undefined8 *)(lVar8 + 0x1c + lVar14);
          in_XMM3._4_4_ = (int)uVar3;
          in_XMM3._0_4_ = *(undefined4 *)(lVar8 + 0x18 + lVar14);
          in_XMM3._8_4_ = (int)((ulong)uVar3 >> 0x20);
          in_XMM3._12_4_ = 0;
          uVar3 = *(undefined8 *)(lVar8 + 0x28 + lVar14);
          in_XMM2._4_4_ = (int)uVar3;
          in_XMM2._0_4_ = *(undefined4 *)(lVar8 + 0x24 + lVar14);
          in_XMM2._8_4_ = (int)((ulong)uVar3 >> 0x20);
          in_XMM2._12_4_ = 0;
        }
        else if (iVar4 == 0xb001) {
          lVar8 = *plVar7;
          lVar14 = uVar13 * plVar7[2];
          auVar40._8_8_ = 0;
          auVar40._0_8_ = *(ulong *)(lVar8 + 0x10 + lVar14);
          auVar23 = insertps(auVar40,*(undefined4 *)(lVar8 + 8 + lVar14),0x20);
          uVar3 = *(undefined8 *)(lVar8 + 0x34 + lVar14);
          auVar70._4_4_ = (int)uVar3;
          auVar70._0_4_ = *(undefined4 *)(lVar8 + lVar14);
          auVar70._8_4_ = (int)((ulong)uVar3 >> 0x20);
          auVar70._12_4_ = 0;
          uVar3 = *(undefined8 *)(lVar8 + 0x1c + lVar14);
          auVar33._4_4_ = (int)uVar3;
          auVar33._0_4_ = *(undefined4 *)(lVar8 + 0x18 + lVar14);
          auVar33._8_4_ = (int)((ulong)uVar3 >> 0x20);
          auVar33._12_4_ = 0;
          fVar51 = *(float *)(lVar8 + 0x24 + lVar14);
          fVar25 = *(float *)(lVar8 + 0x28 + lVar14);
          fVar26 = *(float *)(lVar8 + 0x2c + lVar14);
          fVar29 = *(float *)(lVar8 + 0x30 + lVar14);
          fVar63 = fVar29 * fVar29 + fVar26 * fVar26 + fVar51 * fVar51 + fVar25 * fVar25;
          auVar87 = rsqrtss(ZEXT416((uint)fVar63),ZEXT416((uint)fVar63));
          fVar52 = auVar87._0_4_;
          auVar59._4_12_ = auVar87._4_12_;
          fVar52 = fVar52 * fVar52 * fVar63 * -0.5 * fVar52 + fVar52 * 1.5;
          in_XMM2 = insertps(auVar33,ZEXT416((uint)(fVar51 * fVar52)),0x30);
          in_XMM10 = insertps(auVar70,ZEXT416((uint)(fVar25 * fVar52)),0x30);
          auVar59._0_4_ = fVar52 * fVar29;
          auVar87 = insertps(ZEXT416(*(uint *)(lVar8 + 0xc + lVar14)),
                             *(undefined4 *)(lVar8 + 4 + lVar14),0x10);
          in_XMM3 = insertps(auVar23,auVar59,0x30);
          auVar23 = insertps(auVar87,*(undefined4 *)(lVar8 + 0x3c + lVar14),0x20);
          in_XMM4 = insertps(auVar23,ZEXT416((uint)(fVar26 * fVar52)),0x30);
        }
        else if (iVar4 == 0x9244) {
          lVar8 = *plVar7;
          lVar14 = uVar13 * plVar7[2];
          in_XMM10 = *(undefined1 (*) [16])(lVar8 + lVar14);
          in_XMM4 = *(undefined1 (*) [16])(lVar8 + 0x10 + lVar14);
          in_XMM3 = *(undefined1 (*) [16])(lVar8 + 0x20 + lVar14);
          in_XMM2 = *(undefined1 (*) [16])(lVar8 + 0x30 + lVar14);
        }
        fVar63 = in_XMM2._8_4_;
        fVar51 = in_XMM2._12_4_;
        fVar35 = in_XMM10._12_4_;
        fVar34 = in_XMM4._4_4_;
        fVar29 = in_XMM4._12_4_;
        fVar77 = in_XMM3._8_4_;
        fVar26 = in_XMM3._12_4_;
        fVar69 = fVar35 * fVar29 + fVar26 * fVar51;
        fVar52 = fVar35 * fVar29 - fVar26 * fVar51;
        fVar53 = fVar51 * fVar51 + fVar35 * fVar35 + -fVar29 * fVar29 + -fVar26 * fVar26;
        fVar78 = fVar51 * fVar51 - fVar35 * fVar35;
        fVar66 = fVar29 * fVar29 + fVar78 + -fVar26 * fVar26;
        fVar79 = fVar35 * fVar26 - fVar29 * fVar51;
        fVar25 = fVar29 * fVar51 + fVar35 * fVar26;
        fVar74 = fVar29 * fVar26 + fVar35 * fVar51;
        fVar51 = fVar29 * fVar26 - fVar35 * fVar51;
        fVar69 = fVar69 + fVar69;
        fVar79 = fVar79 + fVar79;
        fVar83 = in_XMM10._0_4_;
        fVar35 = fVar26 * fVar26 + fVar78 + -fVar29 * fVar29;
        fVar54 = fVar53 * 1.0 + fVar69 * 0.0 + fVar79 * 0.0;
        fVar61 = fVar53 * 0.0 + fVar69 * 1.0 + fVar79 * 0.0;
        fVar62 = fVar53 * 0.0 + fVar69 * 0.0 + fVar79 * 1.0;
        fVar79 = fVar53 * 0.0 + fVar69 * 0.0 + fVar79 * 0.0;
        fVar74 = fVar74 + fVar74;
        fVar52 = fVar52 + fVar52;
        fVar53 = fVar52 * 1.0 + fVar66 * 0.0 + fVar74 * 0.0;
        fVar69 = fVar52 * 0.0 + fVar66 * 1.0 + fVar74 * 0.0;
        fVar78 = fVar52 * 0.0 + fVar66 * 0.0 + fVar74 * 1.0;
        fVar66 = fVar52 * 0.0 + fVar66 * 0.0 + fVar74 * 0.0;
        auVar64._0_8_ = in_XMM10._4_8_;
        auVar64._8_8_ = 0;
        auVar23 = blendps(auVar64,in_XMM4,4);
        fVar25 = fVar25 + fVar25;
        fVar51 = fVar51 + fVar51;
        fVar26 = fVar25 * 1.0 + fVar51 * 0.0 + fVar35 * 0.0;
        fVar29 = fVar25 * 0.0 + fVar51 * 1.0 + fVar35 * 0.0;
        fVar52 = fVar25 * 0.0 + fVar51 * 0.0 + fVar35 * 1.0;
        fVar25 = fVar25 * 0.0 + fVar51 * 0.0 + fVar35 * 0.0;
        fVar35 = fVar25 * 0.0;
        in_XMM14._0_4_ = fVar83 * fVar54 + fVar53 * 0.0 + fVar26 * 0.0;
        in_XMM14._4_4_ = fVar83 * fVar61 + fVar69 * 0.0 + fVar29 * 0.0;
        in_XMM14._8_4_ = fVar83 * fVar62 + fVar78 * 0.0 + fVar52 * 0.0;
        in_XMM14._12_4_ = fVar83 * fVar79 + fVar66 * 0.0 + fVar35;
        fVar51 = in_XMM4._0_4_;
        in_XMM1._0_4_ = fVar51 * fVar54 + fVar34 * fVar53 + fVar26 * 0.0;
        in_XMM1._4_4_ = fVar51 * fVar61 + fVar34 * fVar69 + fVar29 * 0.0;
        in_XMM1._8_4_ = fVar51 * fVar62 + fVar34 * fVar78 + fVar52 * 0.0;
        in_XMM1._12_4_ = fVar51 * fVar79 + fVar34 * fVar66 + fVar35;
        fVar34 = in_XMM3._4_4_;
        fVar51 = in_XMM3._0_4_;
        in_XMM0._0_4_ = fVar51 * fVar54 + fVar34 * fVar53 + fVar77 * fVar26;
        in_XMM0._4_4_ = fVar51 * fVar61 + fVar34 * fVar69 + fVar77 * fVar29;
        in_XMM0._8_4_ = fVar51 * fVar62 + fVar34 * fVar78 + fVar77 * fVar52;
        in_XMM0._12_4_ = fVar51 * fVar79 + fVar34 * fVar66 + fVar77 * fVar25;
        fVar25 = in_XMM2._4_4_;
        fVar51 = in_XMM2._0_4_;
        auVar46._0_4_ = fVar51 * fVar54 + fVar25 * fVar53 + fVar63 * fVar26 + auVar23._0_4_ + 0.0;
        auVar46._4_4_ = fVar51 * fVar61 + fVar25 * fVar69 + fVar63 * fVar29 + auVar23._4_4_ + 0.0;
        auVar46._8_4_ = fVar51 * fVar62 + fVar25 * fVar78 + fVar63 * fVar52 + auVar23._8_4_ + 0.0;
      }
      else if (iVar4 == 0x9134) {
        lVar8 = *plVar7;
        lVar14 = uVar13 * plVar7[2];
        auVar23 = insertps(ZEXT416(*(uint *)(lVar8 + lVar14)),*(undefined4 *)(lVar8 + 0x10 + lVar14)
                           ,0x1c);
        in_XMM14 = insertps(auVar23,*(undefined4 *)(lVar8 + 0x20 + lVar14),0x28);
        auVar23 = insertps(ZEXT416(*(uint *)(lVar8 + 4 + lVar14)),
                           *(undefined4 *)(lVar8 + 0x14 + lVar14),0x1c);
        in_XMM1 = insertps(auVar23,*(undefined4 *)(lVar8 + 0x24 + lVar14),0x28);
        auVar23 = insertps(ZEXT416(*(uint *)(lVar8 + 8 + lVar14)),
                           *(undefined4 *)(lVar8 + 0x18 + lVar14),0x1c);
        in_XMM0 = insertps(auVar23,*(undefined4 *)(lVar8 + 0x28 + lVar14),0x28);
        auVar23 = insertps(ZEXT416(*(uint *)(lVar8 + 0xc + lVar14)),
                           *(undefined4 *)(lVar8 + 0x1c + lVar14),0x1c);
        auVar23 = insertps(auVar23,*(undefined4 *)(lVar8 + 0x2c + lVar14),0x28);
        auVar46 = auVar23._0_12_;
      }
      else if (iVar4 == 0x9234) {
        lVar8 = *plVar7;
        lVar14 = uVar13 * plVar7[2];
        uVar3 = *(undefined8 *)(lVar8 + 4 + lVar14);
        in_XMM14._4_4_ = (float)(int)uVar3;
        in_XMM14._0_4_ = (float)*(undefined4 *)(lVar8 + lVar14);
        in_XMM14._8_4_ = (float)(int)((ulong)uVar3 >> 0x20);
        in_XMM14._12_4_ = 0.0;
        uVar3 = *(undefined8 *)(lVar8 + 0x10 + lVar14);
        in_XMM1._4_4_ = (float)(int)uVar3;
        in_XMM1._0_4_ = (float)*(undefined4 *)(lVar8 + 0xc + lVar14);
        in_XMM1._8_4_ = (float)(int)((ulong)uVar3 >> 0x20);
        in_XMM1._12_4_ = 0.0;
        uVar3 = *(undefined8 *)(lVar8 + 0x1c + lVar14);
        in_XMM0._4_4_ = (float)(int)uVar3;
        in_XMM0._0_4_ = (float)*(undefined4 *)(lVar8 + 0x18 + lVar14);
        in_XMM0._8_4_ = (float)(int)((ulong)uVar3 >> 0x20);
        in_XMM0._12_4_ = 0.0;
        uVar3 = *(undefined8 *)(lVar8 + 0x28 + lVar14);
        auVar46._4_4_ = (float)(int)uVar3;
        auVar46._0_4_ = (float)*(undefined4 *)(lVar8 + 0x24 + lVar14);
        auVar46._8_4_ = (float)(int)((ulong)uVar3 >> 0x20);
      }
      else if (iVar4 == 0xb001) {
        lVar8 = *plVar7;
        lVar14 = uVar13 * plVar7[2];
        auVar20._8_8_ = 0;
        auVar20._0_8_ = *(ulong *)(lVar8 + 0x10 + lVar14);
        auVar23 = insertps(auVar20,*(undefined4 *)(lVar8 + 8 + lVar14),0x20);
        uVar3 = *(undefined8 *)(lVar8 + 0x34 + lVar14);
        auVar85._4_4_ = (int)uVar3;
        auVar85._0_4_ = *(undefined4 *)(lVar8 + lVar14);
        auVar85._8_4_ = (int)((ulong)uVar3 >> 0x20);
        auVar85._12_4_ = 0;
        uVar3 = *(undefined8 *)(lVar8 + 0x1c + lVar14);
        auVar47._4_4_ = (int)uVar3;
        auVar47._0_4_ = *(undefined4 *)(lVar8 + 0x18 + lVar14);
        auVar47._8_4_ = (int)((ulong)uVar3 >> 0x20);
        auVar47._12_4_ = 0;
        fVar51 = *(float *)(lVar8 + 0x24 + lVar14);
        fVar25 = *(float *)(lVar8 + 0x28 + lVar14);
        fVar26 = *(float *)(lVar8 + 0x2c + lVar14);
        fVar29 = *(float *)(lVar8 + 0x30 + lVar14);
        fVar63 = fVar29 * fVar29 + fVar26 * fVar26 + fVar51 * fVar51 + fVar25 * fVar25;
        auVar87 = rsqrtss(ZEXT416((uint)fVar63),ZEXT416((uint)fVar63));
        fVar52 = auVar87._0_4_;
        auVar56._4_12_ = auVar87._4_12_;
        fVar52 = fVar52 * fVar52 * fVar63 * -0.5 * fVar52 + fVar52 * 1.5;
        auVar87 = insertps(auVar47,ZEXT416((uint)(fVar51 * fVar52)),0x30);
        auVar46 = auVar87._0_12_;
        in_XMM14 = insertps(auVar85,ZEXT416((uint)(fVar25 * fVar52)),0x30);
        auVar56._0_4_ = fVar52 * fVar29;
        auVar87 = insertps(ZEXT416(*(uint *)(lVar8 + 0xc + lVar14)),
                           *(undefined4 *)(lVar8 + 4 + lVar14),0x10);
        in_XMM0 = insertps(auVar23,auVar56,0x30);
        auVar23 = insertps(auVar87,*(undefined4 *)(lVar8 + 0x3c + lVar14),0x20);
        in_XMM1 = insertps(auVar23,ZEXT416((uint)(fVar26 * fVar52)),0x30);
      }
      else if (iVar4 == 0x9244) {
        lVar8 = *plVar7;
        lVar14 = uVar13 * plVar7[2];
        in_XMM14 = *(undefined1 (*) [16])(lVar8 + lVar14);
        in_XMM1 = *(undefined1 (*) [16])(lVar8 + 0x10 + lVar14);
        in_XMM0 = *(undefined1 (*) [16])(lVar8 + 0x20 + lVar14);
        auVar46 = SUB1612(*(undefined1 (*) [16])(lVar8 + 0x30 + lVar14),0);
      }
    }
    else {
      fVar51 = (pGVar5->time_range).lower;
      auVar30._0_4_ = (pGVar5->time_range).upper - fVar51;
      auVar30._4_8_ = 0;
      fVar25 = (((ray->dir).field_0.m128[3] - fVar51) / auVar30._0_4_) * pGVar5->fnumTimeSegments;
      auVar23 = roundss(ZEXT416((uint)fVar51),ZEXT416((uint)fVar25),9);
      fVar51 = pGVar5->fnumTimeSegments + -1.0;
      if (fVar51 <= auVar23._0_4_) {
        auVar23._0_4_ = fVar51;
      }
      auVar19 = ZEXT812(0);
      if (0.0 <= auVar23._0_4_) {
        auVar19._4_8_ = 0;
        auVar19._0_4_ = auVar23._0_4_;
      }
      auVar87._12_4_ = 0;
      auVar87._0_12_ = auVar19;
      uVar15 = (uint)auVar19._0_4_;
      fVar25 = fVar25 - auVar19._0_4_;
      lVar8 = *(long *)&pGVar5[1].fnumTimeSegments;
      plVar7 = (long *)(lVar8 + (ulong)uVar15 * 0x38);
      iVar4 = *(int *)(lVar8 + 0x20 + (ulong)uVar15 * 0x38);
      if ((pGVar5->field_8).field_0x1 == '\x01') {
        if (iVar4 == 0x9134) {
          lVar14 = *plVar7;
          lVar17 = plVar7[2] * uVar13;
          auVar23 = insertps(ZEXT416(*(uint *)(lVar14 + lVar17)),
                             *(undefined4 *)(lVar14 + 0x10 + lVar17),0x1c);
          _local_188 = insertps(auVar23,*(undefined4 *)(lVar14 + 0x20 + lVar17),0x28);
          auVar23 = insertps(ZEXT416(*(uint *)(lVar14 + 4 + lVar17)),
                             *(undefined4 *)(lVar14 + 0x14 + lVar17),0x1c);
          _local_158 = insertps(auVar23,*(undefined4 *)(lVar14 + 0x24 + lVar17),0x28);
          auVar23 = insertps(ZEXT416(*(uint *)(lVar14 + 8 + lVar17)),
                             *(undefined4 *)(lVar14 + 0x18 + lVar17),0x1c);
          _local_198 = insertps(auVar23,*(undefined4 *)(lVar14 + 0x28 + lVar17),0x28);
          auVar23 = insertps(ZEXT416(*(uint *)(lVar14 + 0xc + lVar17)),
                             *(undefined4 *)(lVar14 + 0x1c + lVar17),0x1c);
          _local_168 = insertps(auVar23,*(undefined4 *)(lVar14 + 0x2c + lVar17),0x28);
        }
        else if (iVar4 == 0x9234) {
          lVar14 = *plVar7;
          lVar17 = plVar7[2] * uVar13;
          uVar3 = *(undefined8 *)(lVar14 + 4 + lVar17);
          local_188._4_4_ = (int)uVar3;
          local_188._0_4_ = *(undefined4 *)(lVar14 + lVar17);
          uStack_180._0_4_ = (float)(int)((ulong)uVar3 >> 0x20);
          uStack_180._4_4_ = 0.0;
          uVar3 = *(undefined8 *)(lVar14 + 0x10 + lVar17);
          local_158._4_4_ = (int)uVar3;
          local_158._0_4_ = *(undefined4 *)(lVar14 + 0xc + lVar17);
          fStack_150 = (float)(int)((ulong)uVar3 >> 0x20);
          fStack_14c = 0.0;
          uVar3 = *(undefined8 *)(lVar14 + 0x1c + lVar17);
          local_198._4_4_ = (int)uVar3;
          local_198._0_4_ = *(undefined4 *)(lVar14 + 0x18 + lVar17);
          uStack_190._0_4_ = (float)(int)((ulong)uVar3 >> 0x20);
          uStack_190._4_4_ = 0.0;
          uVar3 = *(undefined8 *)(lVar14 + 0x28 + lVar17);
          local_168._4_4_ = (int)uVar3;
          local_168._0_4_ = *(undefined4 *)(lVar14 + 0x24 + lVar17);
          fStack_160 = (float)(int)((ulong)uVar3 >> 0x20);
          fStack_15c = 0.0;
        }
        else if (iVar4 == 0xb001) {
          lVar14 = *plVar7;
          lVar17 = plVar7[2] * uVar13;
          auVar68._8_8_ = 0;
          auVar68._0_8_ = *(ulong *)(lVar14 + 0x10 + lVar17);
          auVar87 = insertps(auVar68,*(undefined4 *)(lVar14 + 8 + lVar17),0x20);
          uVar3 = *(undefined8 *)(lVar14 + 0x34 + lVar17);
          auVar75._4_4_ = (int)uVar3;
          auVar75._0_4_ = *(undefined4 *)(lVar14 + lVar17);
          auVar75._8_4_ = (int)((ulong)uVar3 >> 0x20);
          auVar75._12_4_ = 0;
          uVar3 = *(undefined8 *)(lVar14 + 0x1c + lVar17);
          auVar71._4_4_ = (int)uVar3;
          auVar71._0_4_ = *(undefined4 *)(lVar14 + 0x18 + lVar17);
          auVar71._8_4_ = (int)((ulong)uVar3 >> 0x20);
          auVar71._12_4_ = 0;
          fVar51 = *(float *)(lVar14 + 0x24 + lVar17);
          fVar26 = *(float *)(lVar14 + 0x28 + lVar17);
          fVar29 = *(float *)(lVar14 + 0x2c + lVar17);
          fVar52 = *(float *)(lVar14 + 0x30 + lVar17);
          fVar77 = fVar52 * fVar52 + fVar29 * fVar29 + fVar51 * fVar51 + fVar26 * fVar26;
          auVar23 = rsqrtss(ZEXT416((uint)fVar77),ZEXT416((uint)fVar77));
          fVar63 = auVar23._0_4_;
          auVar39._4_12_ = auVar23._4_12_;
          fVar63 = fVar63 * fVar63 * fVar77 * -0.5 * fVar63 + fVar63 * 1.5;
          in_XMM10 = insertps(auVar71,ZEXT416((uint)(fVar51 * fVar63)),0x30);
          in_XMM7 = insertps(auVar75,ZEXT416((uint)(fVar26 * fVar63)),0x30);
          auVar39._0_4_ = fVar63 * fVar52;
          auVar23 = insertps(ZEXT416(*(uint *)(lVar14 + 0xc + lVar17)),
                             *(undefined4 *)(lVar14 + 4 + lVar17),0x10);
          in_XMM9 = insertps(auVar87,auVar39,0x30);
          auVar23 = insertps(auVar23,*(undefined4 *)(lVar14 + 0x3c + lVar17),0x20);
          in_XMM8 = insertps(auVar23,ZEXT416((uint)(fVar29 * fVar63)),0x30);
          _local_198 = in_XMM9;
          _local_188 = in_XMM7;
          _local_168 = in_XMM10;
          _local_158 = in_XMM8;
        }
        else if (iVar4 == 0x9244) {
          lVar14 = *plVar7;
          lVar17 = plVar7[2] * uVar13;
          _local_188 = *(undefined1 (*) [16])(lVar14 + lVar17);
          _local_158 = *(undefined1 (*) [16])(lVar14 + 0x10 + lVar17);
          _local_198 = *(undefined1 (*) [16])(lVar14 + 0x20 + lVar17);
          _local_168 = *(undefined1 (*) [16])(lVar14 + 0x30 + lVar17);
        }
        lVar14 = (ulong)(uVar15 + 1) * 0x38;
        plVar7 = (long *)(lVar8 + lVar14);
        iVar4 = *(int *)(lVar8 + 0x20 + lVar14);
        if (iVar4 == 0x9134) {
          lVar8 = *plVar7;
          lVar14 = uVar13 * plVar7[2];
          auVar23 = insertps(ZEXT416(*(uint *)(lVar8 + lVar14)),
                             *(undefined4 *)(lVar8 + 0x10 + lVar14),0x1c);
          in_XMM7 = insertps(auVar23,*(undefined4 *)(lVar8 + 0x20 + lVar14),0x28);
          auVar23 = insertps(ZEXT416(*(uint *)(lVar8 + 4 + lVar14)),
                             *(undefined4 *)(lVar8 + 0x14 + lVar14),0x1c);
          in_XMM9 = insertps(auVar23,*(undefined4 *)(lVar8 + 0x24 + lVar14),0x28);
          auVar23 = insertps(ZEXT416(*(uint *)(lVar8 + 8 + lVar14)),
                             *(undefined4 *)(lVar8 + 0x18 + lVar14),0x1c);
          in_XMM8 = insertps(auVar23,*(undefined4 *)(lVar8 + 0x28 + lVar14),0x28);
          auVar23 = insertps(ZEXT416(*(uint *)(lVar8 + 0xc + lVar14)),
                             *(undefined4 *)(lVar8 + 0x1c + lVar14),0x1c);
          in_XMM10 = insertps(auVar23,*(undefined4 *)(lVar8 + 0x2c + lVar14),0x28);
        }
        else if (iVar4 == 0x9234) {
          lVar8 = *plVar7;
          lVar14 = uVar13 * plVar7[2];
          uVar3 = *(undefined8 *)(lVar8 + 4 + lVar14);
          in_XMM7._4_4_ = (int)uVar3;
          in_XMM7._0_4_ = *(undefined4 *)(lVar8 + lVar14);
          in_XMM7._8_4_ = (int)((ulong)uVar3 >> 0x20);
          in_XMM7._12_4_ = 0;
          uVar3 = *(undefined8 *)(lVar8 + 0x10 + lVar14);
          in_XMM9._4_4_ = (int)uVar3;
          in_XMM9._0_4_ = *(undefined4 *)(lVar8 + 0xc + lVar14);
          in_XMM9._8_4_ = (int)((ulong)uVar3 >> 0x20);
          in_XMM9._12_4_ = 0;
          uVar3 = *(undefined8 *)(lVar8 + 0x1c + lVar14);
          in_XMM8._4_4_ = (int)uVar3;
          in_XMM8._0_4_ = *(undefined4 *)(lVar8 + 0x18 + lVar14);
          in_XMM8._8_4_ = (int)((ulong)uVar3 >> 0x20);
          in_XMM8._12_4_ = 0;
          uVar3 = *(undefined8 *)(lVar8 + 0x28 + lVar14);
          in_XMM10._4_4_ = (int)uVar3;
          in_XMM10._0_4_ = *(undefined4 *)(lVar8 + 0x24 + lVar14);
          in_XMM10._8_4_ = (int)((ulong)uVar3 >> 0x20);
          in_XMM10._12_4_ = 0;
        }
        else if (iVar4 == 0xb001) {
          lVar8 = *plVar7;
          lVar14 = uVar13 * plVar7[2];
          auVar65._8_8_ = 0;
          auVar65._0_8_ = *(ulong *)(lVar8 + 0x10 + lVar14);
          auVar87 = insertps(auVar65,*(undefined4 *)(lVar8 + 8 + lVar14),0x20);
          uVar3 = *(undefined8 *)(lVar8 + 0x34 + lVar14);
          auVar60._4_4_ = (int)uVar3;
          auVar60._0_4_ = *(undefined4 *)(lVar8 + lVar14);
          auVar60._8_4_ = (int)((ulong)uVar3 >> 0x20);
          auVar60._12_4_ = 0;
          uVar3 = *(undefined8 *)(lVar8 + 0x1c + lVar14);
          auVar72._4_4_ = (int)uVar3;
          auVar72._0_4_ = *(undefined4 *)(lVar8 + 0x18 + lVar14);
          auVar72._8_4_ = (int)((ulong)uVar3 >> 0x20);
          auVar72._12_4_ = 0;
          fVar51 = *(float *)(lVar8 + 0x24 + lVar14);
          fVar26 = *(float *)(lVar8 + 0x28 + lVar14);
          fVar29 = *(float *)(lVar8 + 0x2c + lVar14);
          fVar52 = *(float *)(lVar8 + 0x30 + lVar14);
          fVar77 = fVar52 * fVar52 + fVar29 * fVar29 + fVar51 * fVar51 + fVar26 * fVar26;
          auVar23 = rsqrtss(ZEXT416((uint)fVar77),ZEXT416((uint)fVar77));
          fVar63 = auVar23._0_4_;
          auVar44._4_12_ = auVar23._4_12_;
          fVar63 = fVar63 * fVar63 * fVar77 * -0.5 * fVar63 + fVar63 * 1.5;
          in_XMM10 = insertps(auVar72,ZEXT416((uint)(fVar51 * fVar63)),0x30);
          in_XMM7 = insertps(auVar60,ZEXT416((uint)(fVar26 * fVar63)),0x30);
          auVar44._0_4_ = fVar63 * fVar52;
          auVar23 = insertps(ZEXT416(*(uint *)(lVar8 + 0xc + lVar14)),
                             *(undefined4 *)(lVar8 + 4 + lVar14),0x10);
          in_XMM8 = insertps(auVar87,auVar44,0x30);
          auVar23 = insertps(auVar23,*(undefined4 *)(lVar8 + 0x3c + lVar14),0x20);
          in_XMM9 = insertps(auVar23,ZEXT416((uint)(fVar29 * fVar63)),0x30);
        }
        else if (iVar4 == 0x9244) {
          lVar8 = *plVar7;
          lVar14 = uVar13 * plVar7[2];
          in_XMM7 = *(undefined1 (*) [16])(lVar8 + lVar14);
          in_XMM9 = *(undefined1 (*) [16])(lVar8 + 0x10 + lVar14);
          in_XMM8 = *(undefined1 (*) [16])(lVar8 + 0x20 + lVar14);
          in_XMM10 = *(undefined1 (*) [16])(lVar8 + 0x30 + lVar14);
        }
        fVar51 = in_XMM10._12_4_;
        fVar26 = in_XMM7._12_4_;
        fVar63 = in_XMM9._12_4_;
        local_c8 = in_XMM8._12_4_;
        fVar52 = uStack_190._4_4_ * local_c8 +
                 fStack_14c * fVar63 + fStack_15c * fVar51 + uStack_180._4_4_ * fVar26;
        fVar29 = -fVar52;
        if (fVar52 < fVar29) {
          fVar51 = -fVar51;
          fVar26 = -fVar26;
          local_c8 = -local_c8;
        }
        fVar77 = fVar29;
        if (fVar29 <= fVar52) {
          fVar77 = fVar52;
        }
        fVar35 = ABS(fVar52);
        local_148 = -fVar63;
        fVar34 = 1.0 - fVar35;
        if (fVar34 < 0.0) {
          fVar34 = sqrtf(fVar34);
        }
        else {
          fVar34 = SQRT(fVar34);
        }
        fVar53 = 1.5707964 -
                 fVar34 * (((((fVar35 * -0.0043095737 + 0.0192803) * fVar35 + -0.04489909) * fVar35
                            + 0.08785567) * fVar35 + -0.21450998) * fVar35 + 1.5707952);
        fVar34 = 0.0;
        if (0.0 <= fVar53) {
          fVar34 = fVar53;
        }
        fVar35 = (float)(-(uint)(1.0 < fVar35) & 0x7fc00000 |
                        ~-(uint)(1.0 < fVar35) &
                        (uint)(1.5707964 -
                              (float)((uint)-fVar34 & -(uint)(fVar77 < 0.0) |
                                     ~-(uint)(fVar77 < 0.0) & (uint)fVar34))) * fVar25;
        auVar23 = ZEXT416((uint)(fVar35 * 0.63661975));
        auVar23 = roundss(auVar23,auVar23,9);
        uVar15 = (uint)auVar23._0_4_;
        fVar35 = fVar35 - auVar23._0_4_ * 1.5707964;
        fVar34 = fVar35 * fVar35;
        uVar16 = uVar15 & 3;
        fVar53 = ((((fVar34 * -2.5963018e-07 + 2.4756235e-05) * fVar34 + -0.001388833) * fVar34 +
                  0.04166664) * fVar34 + -0.5) * fVar34 + 1.0;
        fVar35 = (((((fVar34 * -2.5029328e-08 + 2.7600126e-06) * fVar34 + -0.00019842605) * fVar34 +
                   0.008333348) * fVar34 + -0.16666667) * fVar34 + 1.0) * fVar35;
        fVar34 = fVar53;
        if ((uVar15 & 1) != 0) {
          fVar34 = fVar35;
          fVar35 = fVar53;
        }
        fVar29 = (float)(~-(uint)(fVar52 < fVar29) & (uint)fVar63 |
                        (uint)local_148 & -(uint)(fVar52 < fVar29));
        if (1 < uVar16) {
          fVar35 = -fVar35;
        }
        if (uVar16 - 1 < 2) {
          fVar34 = -fVar34;
        }
        fVar52 = fVar77 * fStack_15c - fVar51;
        fVar66 = fVar77 * uStack_180._4_4_ - fVar26;
        fVar78 = fVar77 * fStack_14c - fVar29;
        fVar69 = fVar77 * uStack_190._4_4_ - local_c8;
        auVar48._0_8_ = CONCAT44(uStack_190._4_4_,fVar69) ^ 0x8000000000000000;
        auVar48._8_4_ = -uStack_190._4_4_;
        auVar48._12_4_ = -uStack_190._4_4_;
        auVar49._4_12_ = auVar48._4_12_;
        auVar49._0_4_ = fVar69 * fVar69 + fVar78 * fVar78 + fVar52 * fVar52 + fVar66 * fVar66;
        auVar73._0_8_ = CONCAT44(uStack_190._4_4_,auVar49._0_4_) ^ 0x8000000000000000;
        auVar73._8_4_ = -uStack_190._4_4_;
        auVar73._12_4_ = -uStack_190._4_4_;
        auVar23 = rsqrtss(auVar73,auVar49);
        fVar53 = auVar23._0_4_;
        fVar54 = fVar53 * fVar53 * auVar49._0_4_ * -0.5 * fVar53 + fVar53 * 1.5;
        fVar61 = 1.0 - fVar25;
        fVar79 = fStack_15c * fVar61 + fVar51 * fVar25;
        fVar53 = fVar61 * uStack_180._4_4_ + fVar26 * fVar25;
        fVar51 = fVar61 * fStack_14c + fVar29 * fVar25;
        fVar26 = fVar61 * uStack_190._4_4_ + local_c8 * fVar25;
        fVar62 = fVar26 * fVar26 + fVar51 * fVar51 + fVar79 * fVar79 + fVar53 * fVar53;
        auVar23 = rsqrtss(ZEXT416((uint)fVar62),ZEXT416((uint)fVar62));
        fVar29 = auVar23._0_4_;
        fVar62 = fVar29 * fVar29 * fVar62 * -0.5 * fVar29 + fVar29 * 1.5;
        fVar29 = (float)(-(uint)(0.9995 < fVar77) & (uint)(fVar79 * fVar62) |
                        ~-(uint)(0.9995 < fVar77) &
                        (uint)(fVar34 * fStack_15c - fVar52 * fVar54 * fVar35));
        if (0.9995 < fVar77) {
          fVar53 = fVar53 * fVar62;
          fVar51 = fVar51 * fVar62;
          fVar26 = fVar26 * fVar62;
        }
        else {
          fVar53 = uStack_180._4_4_ * fVar34 - fVar66 * fVar54 * fVar35;
          fVar51 = fStack_14c * fVar34 - fVar78 * fVar54 * fVar35;
          fVar26 = uStack_190._4_4_ * fVar34 - fVar69 * fVar54 * fVar35;
        }
        local_48 = in_XMM7._0_4_;
        fStack_44 = in_XMM7._4_4_;
        fStack_40 = in_XMM7._8_4_;
        fVar84 = (float)local_188._0_4_ * fVar61 + local_48 * fVar25;
        local_68 = in_XMM9._0_4_;
        fStack_64 = in_XMM9._4_4_;
        fStack_60 = in_XMM9._8_4_;
        fVar89 = (float)local_158._0_4_ * fVar61 + local_68 * fVar25;
        fVar90 = (float)local_158._4_4_ * fVar61 + fStack_64 * fVar25;
        local_58 = in_XMM8._0_4_;
        fStack_54 = in_XMM8._4_4_;
        fStack_50 = in_XMM8._8_4_;
        fVar78 = (float)local_198._0_4_ * fVar61 + local_58 * fVar25;
        fVar62 = (float)local_198._4_4_ * fVar61 + fStack_54 * fVar25;
        fVar74 = (float)uStack_190 * fVar61 + fStack_50 * fVar25;
        local_78 = in_XMM10._0_4_;
        fStack_74 = in_XMM10._4_4_;
        fStack_70 = in_XMM10._8_4_;
        fVar80 = fVar61 * (float)local_168._0_4_ + fVar25 * local_78;
        fVar81 = fVar61 * (float)local_168._4_4_ + fVar25 * fStack_74;
        fVar82 = fVar61 * fStack_160 + fVar25 * fStack_70;
        fVar34 = fVar29 * fVar29 + fVar53 * fVar53 + -fVar51 * fVar51 + -fVar26 * fVar26;
        fVar54 = fVar53 * fVar51 + fVar29 * fVar26;
        fVar66 = fVar53 * fVar51 - fVar29 * fVar26;
        fVar77 = fVar29 * fVar29 - fVar53 * fVar53;
        fVar67 = fVar51 * fVar51 + fVar77 + -fVar26 * fVar26;
        fVar79 = fVar53 * fVar26 - fVar29 * fVar51;
        fVar52 = fVar29 * fVar51 + fVar53 * fVar26;
        fVar45 = fVar51 * fVar26 + fVar29 * fVar53;
        fVar29 = fVar51 * fVar26 - fVar29 * fVar53;
        fVar54 = fVar54 + fVar54;
        fVar79 = fVar79 + fVar79;
        fVar77 = fVar26 * fVar26 + fVar77 + -fVar51 * fVar51;
        fVar35 = fVar34 * 1.0 + fVar54 * 0.0 + fVar79 * 0.0;
        fVar53 = fVar34 * 0.0 + fVar54 * 1.0 + fVar79 * 0.0;
        fVar69 = fVar34 * 0.0 + fVar54 * 0.0 + fVar79 * 1.0;
        fVar34 = fVar34 * 0.0 + fVar54 * 0.0 + fVar79 * 0.0;
        fVar45 = fVar45 + fVar45;
        fVar66 = fVar66 + fVar66;
        fVar54 = fVar66 * 1.0 + fVar67 * 0.0 + fVar45 * 0.0;
        fVar79 = fVar66 * 0.0 + fVar67 * 1.0 + fVar45 * 0.0;
        fVar83 = fVar66 * 0.0 + fVar67 * 0.0 + fVar45 * 1.0;
        fVar66 = fVar66 * 0.0 + fVar67 * 0.0 + fVar45 * 0.0;
        auVar50._4_4_ = (float)uStack_180 * fVar61 + fStack_40 * fVar25;
        auVar50._0_4_ = (float)local_188._4_4_ * fVar61 + fStack_44 * fVar25;
        auVar50._8_8_ = 0;
        auVar9._4_4_ = fVar90;
        auVar9._0_4_ = fVar89;
        auVar9._8_4_ = fStack_150 * fVar61 + fStack_60 * fVar25;
        auVar9._12_4_ = fStack_14c * fVar61 + fVar63 * fVar25;
        auVar23 = blendps(auVar50,auVar9,4);
        fVar52 = fVar52 + fVar52;
        fVar29 = fVar29 + fVar29;
        fVar51 = fVar52 * 1.0 + fVar29 * 0.0 + fVar77 * 0.0;
        fVar25 = fVar52 * 0.0 + fVar29 * 1.0 + fVar77 * 0.0;
        fVar26 = fVar52 * 0.0 + fVar29 * 0.0 + fVar77 * 1.0;
        fVar29 = fVar52 * 0.0 + fVar29 * 0.0 + fVar77 * 0.0;
        fVar52 = fVar29 * 0.0;
        in_XMM14._0_4_ = fVar84 * fVar35 + fVar54 * 0.0 + fVar51 * 0.0;
        in_XMM14._4_4_ = fVar84 * fVar53 + fVar79 * 0.0 + fVar25 * 0.0;
        in_XMM14._8_4_ = fVar84 * fVar69 + fVar83 * 0.0 + fVar26 * 0.0;
        in_XMM14._12_4_ = fVar84 * fVar34 + fVar66 * 0.0 + fVar52;
        in_XMM1._0_4_ = fVar89 * fVar35 + fVar90 * fVar54 + fVar51 * 0.0;
        in_XMM1._4_4_ = fVar89 * fVar53 + fVar90 * fVar79 + fVar25 * 0.0;
        in_XMM1._8_4_ = fVar89 * fVar69 + fVar90 * fVar83 + fVar26 * 0.0;
        in_XMM1._12_4_ = fVar89 * fVar34 + fVar90 * fVar66 + fVar52;
        in_XMM0._0_4_ = fVar78 * fVar35 + fVar62 * fVar54 + fVar74 * fVar51;
        in_XMM0._4_4_ = fVar78 * fVar53 + fVar62 * fVar79 + fVar74 * fVar25;
        in_XMM0._8_4_ = fVar78 * fVar69 + fVar62 * fVar83 + fVar74 * fVar26;
        in_XMM0._12_4_ = fVar78 * fVar34 + fVar62 * fVar66 + fVar74 * fVar29;
        auVar46._0_4_ = fVar80 * fVar35 + fVar81 * fVar54 + fVar82 * fVar51 + auVar23._0_4_ + 0.0;
        auVar46._4_4_ = fVar80 * fVar53 + fVar81 * fVar79 + fVar82 * fVar25 + auVar23._4_4_ + 0.0;
        auVar46._8_4_ = fVar80 * fVar69 + fVar81 * fVar83 + fVar82 * fVar26 + auVar23._8_4_ + 0.0;
      }
      else {
        if (iVar4 == 0x9134) {
          lVar14 = *plVar7;
          lVar17 = plVar7[2] * uVar13;
          auVar23 = insertps(ZEXT416(*(uint *)(lVar14 + lVar17)),
                             *(undefined4 *)(lVar14 + 0x10 + lVar17),0x1c);
          in_XMM14 = insertps(auVar23,*(undefined4 *)(lVar14 + 0x20 + lVar17),0x28);
          auVar23 = insertps(ZEXT416(*(uint *)(lVar14 + 4 + lVar17)),
                             *(undefined4 *)(lVar14 + 0x14 + lVar17),0x1c);
          auVar23 = insertps(auVar23,*(undefined4 *)(lVar14 + 0x24 + lVar17),0x28);
          auVar87 = insertps(ZEXT416(*(uint *)(lVar14 + 8 + lVar17)),
                             *(undefined4 *)(lVar14 + 0x18 + lVar17),0x1c);
          auVar87 = insertps(auVar87,*(undefined4 *)(lVar14 + 0x28 + lVar17),0x28);
          auVar39 = insertps(ZEXT416(*(uint *)(lVar14 + 0xc + lVar17)),
                             *(undefined4 *)(lVar14 + 0x1c + lVar17),0x1c);
          auVar39 = insertps(auVar39,*(undefined4 *)(lVar14 + 0x2c + lVar17),0x28);
          auVar30 = auVar39._0_12_;
        }
        else if (iVar4 == 0x9234) {
          lVar14 = *plVar7;
          lVar17 = plVar7[2] * uVar13;
          uVar3 = *(undefined8 *)(lVar14 + 4 + lVar17);
          in_XMM14._4_4_ = (float)(int)uVar3;
          in_XMM14._0_4_ = (float)*(undefined4 *)(lVar14 + lVar17);
          in_XMM14._8_4_ = (float)(int)((ulong)uVar3 >> 0x20);
          in_XMM14._12_4_ = 0.0;
          uVar3 = *(undefined8 *)(lVar14 + 0x10 + lVar17);
          auVar23._4_4_ = (int)uVar3;
          auVar23._0_4_ = *(undefined4 *)(lVar14 + 0xc + lVar17);
          auVar23._8_4_ = (int)((ulong)uVar3 >> 0x20);
          auVar23._12_4_ = 0;
          uVar3 = *(undefined8 *)(lVar14 + 0x1c + lVar17);
          auVar87._4_4_ = (int)uVar3;
          auVar87._0_4_ = *(undefined4 *)(lVar14 + 0x18 + lVar17);
          auVar87._8_4_ = (int)((ulong)uVar3 >> 0x20);
          auVar87._12_4_ = 0;
          uVar2 = *(ulong *)(lVar14 + 0x28 + lVar17);
          in_XMM3._8_8_ = 0;
          in_XMM3._0_8_ = uVar2;
          auVar30._4_4_ = (int)uVar2;
          auVar30._0_4_ = (float)*(undefined4 *)(lVar14 + 0x24 + lVar17);
          auVar30._8_4_ = (int)(uVar2 >> 0x20);
        }
        else if (iVar4 == 0xb001) {
          lVar14 = *plVar7;
          lVar17 = plVar7[2] * uVar13;
          auVar21._8_8_ = 0;
          auVar21._0_8_ = *(ulong *)(lVar14 + 0x10 + lVar17);
          auVar23 = insertps(auVar21,*(undefined4 *)(lVar14 + 8 + lVar17),0x20);
          uVar3 = *(undefined8 *)(lVar14 + 0x34 + lVar17);
          auVar86._4_4_ = (int)uVar3;
          auVar86._0_4_ = *(undefined4 *)(lVar14 + lVar17);
          auVar86._8_4_ = (int)((ulong)uVar3 >> 0x20);
          auVar86._12_4_ = 0;
          uVar3 = *(undefined8 *)(lVar14 + 0x1c + lVar17);
          auVar31._4_4_ = (int)uVar3;
          auVar31._0_4_ = *(undefined4 *)(lVar14 + 0x18 + lVar17);
          auVar31._8_4_ = (int)((ulong)uVar3 >> 0x20);
          auVar31._12_4_ = 0;
          fVar51 = *(float *)(lVar14 + 0x24 + lVar17);
          fVar26 = *(float *)(lVar14 + 0x28 + lVar17);
          fVar29 = *(float *)(lVar14 + 0x2c + lVar17);
          fVar52 = *(float *)(lVar14 + 0x30 + lVar17);
          in_XMM4 = ZEXT416((uint)fVar52);
          fVar77 = fVar52 * fVar52 + fVar29 * fVar29 + fVar51 * fVar51 + fVar26 * fVar26;
          auVar87 = rsqrtss(ZEXT416((uint)fVar77),ZEXT416((uint)fVar77));
          fVar63 = auVar87._0_4_;
          auVar57._4_12_ = auVar87._4_12_;
          fVar63 = fVar63 * fVar63 * fVar77 * -0.5 * fVar63 + fVar63 * 1.5;
          in_XMM6 = ZEXT416((uint)(fVar51 * fVar63));
          auVar87 = insertps(auVar31,in_XMM6,0x30);
          auVar30 = auVar87._0_12_;
          in_XMM14 = insertps(auVar86,ZEXT416((uint)(fVar26 * fVar63)),0x30);
          in_XMM3 = ZEXT416((uint)(fVar29 * fVar63));
          auVar57._0_4_ = fVar63 * fVar52;
          auVar55 = auVar57._0_12_;
          auVar39 = insertps(ZEXT416(*(uint *)(lVar14 + 0xc + lVar17)),
                             *(undefined4 *)(lVar14 + 4 + lVar17),0x10);
          auVar87 = insertps(auVar23,auVar57,0x30);
          auVar23 = insertps(auVar39,*(undefined4 *)(lVar14 + 0x3c + lVar17),0x20);
          auVar23 = insertps(auVar23,in_XMM3,0x30);
        }
        else if (iVar4 == 0x9244) {
          lVar14 = *plVar7;
          lVar17 = plVar7[2] * uVar13;
          in_XMM14 = *(undefined1 (*) [16])(lVar14 + lVar17);
          auVar23 = *(undefined1 (*) [16])(lVar14 + 0x10 + lVar17);
          auVar87 = *(undefined1 (*) [16])(lVar14 + 0x20 + lVar17);
          auVar30 = SUB1612(*(undefined1 (*) [16])(lVar14 + 0x30 + lVar17),0);
        }
        lVar14 = (ulong)(uVar15 + 1) * 0x38;
        plVar7 = (long *)(lVar8 + lVar14);
        iVar4 = *(int *)(lVar8 + 0x20 + lVar14);
        if (iVar4 == 0x9134) {
          lVar8 = *plVar7;
          lVar14 = uVar13 * plVar7[2];
          auVar39 = insertps(ZEXT416(*(uint *)(lVar8 + lVar14)),
                             *(undefined4 *)(lVar8 + 0x10 + lVar14),0x1c);
          in_XMM4 = insertps(auVar39,*(undefined4 *)(lVar8 + 0x20 + lVar14),0x28);
          auVar39 = insertps(ZEXT416(*(uint *)(lVar8 + 4 + lVar14)),
                             *(undefined4 *)(lVar8 + 0x14 + lVar14),0x1c);
          in_XMM6 = insertps(auVar39,*(undefined4 *)(lVar8 + 0x24 + lVar14),0x28);
          auVar39 = insertps(ZEXT416(*(uint *)(lVar8 + 8 + lVar14)),
                             *(undefined4 *)(lVar8 + 0x18 + lVar14),0x1c);
          in_XMM3 = insertps(auVar39,*(undefined4 *)(lVar8 + 0x28 + lVar14),0x28);
          auVar39 = insertps(ZEXT416(*(uint *)(lVar8 + 0xc + lVar14)),
                             *(undefined4 *)(lVar8 + 0x1c + lVar14),0x1c);
          auVar39 = insertps(auVar39,*(undefined4 *)(lVar8 + 0x2c + lVar14),0x28);
          auVar55 = auVar39._0_12_;
        }
        else if (iVar4 == 0x9234) {
          lVar8 = *plVar7;
          lVar14 = uVar13 * plVar7[2];
          uVar3 = *(undefined8 *)(lVar8 + 4 + lVar14);
          in_XMM4._4_4_ = (int)uVar3;
          in_XMM4._0_4_ = *(undefined4 *)(lVar8 + lVar14);
          in_XMM4._8_4_ = (int)((ulong)uVar3 >> 0x20);
          in_XMM4._12_4_ = 0;
          uVar3 = *(undefined8 *)(lVar8 + 0x10 + lVar14);
          in_XMM6._4_4_ = (int)uVar3;
          in_XMM6._0_4_ = *(undefined4 *)(lVar8 + 0xc + lVar14);
          in_XMM6._8_4_ = (int)((ulong)uVar3 >> 0x20);
          in_XMM6._12_4_ = 0;
          uVar3 = *(undefined8 *)(lVar8 + 0x1c + lVar14);
          in_XMM3._4_4_ = (int)uVar3;
          in_XMM3._0_4_ = *(undefined4 *)(lVar8 + 0x18 + lVar14);
          in_XMM3._8_4_ = (int)((ulong)uVar3 >> 0x20);
          in_XMM3._12_4_ = 0;
          uVar3 = *(undefined8 *)(lVar8 + 0x28 + lVar14);
          auVar55._4_4_ = (int)uVar3;
          auVar55._0_4_ = *(undefined4 *)(lVar8 + 0x24 + lVar14);
          auVar55._8_4_ = (int)((ulong)uVar3 >> 0x20);
        }
        else if (iVar4 == 0xb001) {
          lVar8 = *plVar7;
          lVar14 = uVar13 * plVar7[2];
          auVar36._8_8_ = 0;
          auVar36._0_8_ = *(ulong *)(lVar8 + 0x10 + lVar14);
          auVar39 = insertps(auVar36,*(undefined4 *)(lVar8 + 8 + lVar14),0x20);
          uVar3 = *(undefined8 *)(lVar8 + 0x34 + lVar14);
          auVar41._4_4_ = (int)uVar3;
          auVar41._0_4_ = *(undefined4 *)(lVar8 + lVar14);
          auVar41._8_4_ = (int)((ulong)uVar3 >> 0x20);
          auVar41._12_4_ = 0;
          uVar3 = *(undefined8 *)(lVar8 + 0x1c + lVar14);
          auVar58._4_4_ = (int)uVar3;
          auVar58._0_4_ = *(undefined4 *)(lVar8 + 0x18 + lVar14);
          auVar58._8_4_ = (int)((ulong)uVar3 >> 0x20);
          auVar58._12_4_ = 0;
          fVar51 = *(float *)(lVar8 + 0x24 + lVar14);
          fVar26 = *(float *)(lVar8 + 0x28 + lVar14);
          fVar29 = *(float *)(lVar8 + 0x2c + lVar14);
          fVar52 = *(float *)(lVar8 + 0x30 + lVar14);
          fVar77 = fVar52 * fVar52 + fVar29 * fVar29 + fVar51 * fVar51 + fVar26 * fVar26;
          auVar75 = rsqrtss(ZEXT416((uint)fVar77),ZEXT416((uint)fVar77));
          fVar63 = auVar75._0_4_;
          auVar76._4_12_ = auVar75._4_12_;
          fVar63 = fVar63 * fVar63 * fVar77 * -0.5 * fVar63 + fVar63 * 1.5;
          auVar75 = insertps(auVar58,ZEXT416((uint)(fVar51 * fVar63)),0x30);
          auVar55 = auVar75._0_12_;
          in_XMM4 = insertps(auVar41,ZEXT416((uint)(fVar26 * fVar63)),0x30);
          auVar76._0_4_ = fVar63 * fVar52;
          auVar75 = insertps(ZEXT416(*(uint *)(lVar8 + 0xc + lVar14)),
                             *(undefined4 *)(lVar8 + 4 + lVar14),0x10);
          in_XMM3 = insertps(auVar39,auVar76,0x30);
          auVar39 = insertps(auVar75,*(undefined4 *)(lVar8 + 0x3c + lVar14),0x20);
          in_XMM6 = insertps(auVar39,ZEXT416((uint)(fVar29 * fVar63)),0x30);
        }
        else if (iVar4 == 0x9244) {
          lVar8 = *plVar7;
          lVar14 = uVar13 * plVar7[2];
          in_XMM4 = *(undefined1 (*) [16])(lVar8 + lVar14);
          in_XMM6 = *(undefined1 (*) [16])(lVar8 + 0x10 + lVar14);
          in_XMM3 = *(undefined1 (*) [16])(lVar8 + 0x20 + lVar14);
          auVar55 = SUB1612(*(undefined1 (*) [16])(lVar8 + 0x30 + lVar14),0);
        }
        fVar51 = 1.0 - fVar25;
        fVar26 = in_XMM14._4_4_;
        fVar29 = in_XMM14._8_4_;
        fVar52 = in_XMM14._12_4_;
        in_XMM14._0_4_ = in_XMM14._0_4_ * fVar51 + in_XMM4._0_4_ * fVar25;
        in_XMM14._4_4_ = fVar26 * fVar51 + in_XMM4._4_4_ * fVar25;
        in_XMM14._8_4_ = fVar29 * fVar51 + in_XMM4._8_4_ * fVar25;
        in_XMM14._12_4_ = fVar52 * fVar51 + in_XMM4._12_4_ * fVar25;
        in_XMM1._0_4_ = auVar23._0_4_ * fVar51 + in_XMM6._0_4_ * fVar25;
        in_XMM1._4_4_ = auVar23._4_4_ * fVar51 + in_XMM6._4_4_ * fVar25;
        in_XMM1._8_4_ = auVar23._8_4_ * fVar51 + in_XMM6._8_4_ * fVar25;
        in_XMM1._12_4_ = auVar23._12_4_ * fVar51 + in_XMM6._12_4_ * fVar25;
        in_XMM0._0_4_ = auVar87._0_4_ * fVar51 + in_XMM3._0_4_ * fVar25;
        in_XMM0._4_4_ = auVar87._4_4_ * fVar51 + in_XMM3._4_4_ * fVar25;
        in_XMM0._8_4_ = auVar87._8_4_ * fVar51 + in_XMM3._8_4_ * fVar25;
        in_XMM0._12_4_ = auVar87._12_4_ * fVar51 + in_XMM3._12_4_ * fVar25;
        auVar46._0_4_ = fVar51 * auVar30._0_4_ + fVar25 * auVar55._0_4_;
        auVar46._4_4_ = fVar51 * auVar30._4_4_ + fVar25 * auVar55._4_4_;
        auVar46._8_4_ = fVar51 * auVar30._8_4_ + fVar25 * auVar55._8_4_;
      }
    }
    fVar51 = in_XMM0._0_4_;
    fVar25 = in_XMM0._4_4_;
    fVar26 = in_XMM0._8_4_;
    fVar29 = in_XMM0._12_4_;
    fVar52 = in_XMM1._0_4_;
    fVar63 = in_XMM1._4_4_;
    fVar77 = in_XMM1._8_4_;
    auVar32._0_4_ = fVar52 * fVar25 - fVar51 * fVar63;
    fVar34 = fVar63 * fVar26 - fVar25 * fVar77;
    fVar35 = fVar77 * fVar51 - fVar26 * fVar52;
    auVar37._4_4_ = fVar35;
    auVar37._0_4_ = fVar34;
    auVar37._8_4_ = auVar32._0_4_;
    auVar37._12_4_ = in_XMM1._12_4_ * fVar29 - fVar29 * in_XMM1._12_4_;
    fVar53 = in_XMM14._0_4_;
    fVar69 = in_XMM14._4_4_;
    fVar78 = in_XMM14._8_4_;
    auVar22._0_4_ = fVar51 * fVar69 - fVar25 * fVar53;
    auVar22._4_4_ = fVar25 * fVar78 - fVar26 * fVar69;
    auVar22._8_4_ = fVar26 * fVar53 - fVar51 * fVar78;
    auVar22._12_4_ = fVar29 * in_XMM14._12_4_ - fVar29 * in_XMM14._12_4_;
    fVar51 = fVar77 * fVar69 - fVar78 * fVar63;
    auVar87 = dpps(in_XMM14,auVar37,0x7f);
    auVar28._4_4_ = fVar51;
    auVar28._0_4_ = fVar34;
    auVar23 = insertps(auVar22,auVar22,0x4a);
    auVar32._4_4_ = auVar22._0_4_;
    auVar32._8_4_ = fVar63 * fVar53 - fVar69 * fVar52;
    auVar32._12_4_ = 0;
    auVar28._8_4_ = fVar51;
    auVar28._12_4_ = auVar23._4_4_;
    auVar27._8_8_ = auVar28._8_8_;
    auVar27._4_4_ = auVar23._0_4_;
    auVar27._0_4_ = fVar34;
    auVar38._4_4_ = auVar23._8_4_;
    auVar38._0_4_ = fVar35;
    auVar38._8_4_ = fVar52 * fVar78 - fVar53 * fVar77;
    auVar38._12_4_ = auVar23._12_4_;
    auVar88._0_4_ = auVar87._0_4_;
    auVar88._4_4_ = auVar88._0_4_;
    auVar88._8_4_ = auVar88._0_4_;
    auVar88._12_4_ = auVar88._0_4_;
    auVar23 = divps(auVar27,auVar88);
    auVar39 = divps(auVar38,auVar88);
    auVar87 = divps(auVar32,auVar88);
    fVar83 = auVar46._0_4_;
    fVar45 = auVar46._4_4_;
    fVar67 = auVar46._8_4_;
    fVar69 = auVar87._0_4_;
    fVar78 = auVar87._4_4_;
    fVar66 = auVar87._8_4_;
    fVar54 = auVar87._12_4_;
    fVar61 = auVar39._0_4_;
    fVar62 = auVar39._4_4_;
    fVar79 = auVar39._8_4_;
    fVar74 = auVar39._12_4_;
    fVar77 = auVar23._0_4_;
    fVar34 = auVar23._4_4_;
    fVar35 = auVar23._8_4_;
    fVar53 = auVar23._12_4_;
    fVar51 = (ray->org).field_0.m128[0];
    fVar25 = (ray->org).field_0.m128[1];
    fVar26 = (ray->org).field_0.m128[2];
    auVar46 = *(undefined1 (*) [12])&(ray->org).field_0;
    aVar10 = (ray->org).field_0;
    pVVar1 = &ray->dir;
    fVar29 = (pVVar1->field_0).m128[0];
    fVar52 = (ray->dir).field_0.m128[1];
    fVar63 = (ray->dir).field_0.m128[2];
    auVar55 = *(undefined1 (*) [12])&pVVar1->field_0;
    aVar11 = pVVar1->field_0;
    auVar42._0_4_ =
         fVar51 * fVar77 +
         fVar25 * fVar61 + (fVar26 * fVar69 - (fVar83 * fVar77 + fVar45 * fVar61 + fVar67 * fVar69))
    ;
    auVar42._4_4_ =
         fVar51 * fVar34 +
         fVar25 * fVar62 + (fVar26 * fVar78 - (fVar83 * fVar34 + fVar45 * fVar62 + fVar67 * fVar78))
    ;
    auVar42._8_4_ =
         fVar51 * fVar35 +
         fVar25 * fVar79 + (fVar26 * fVar66 - (fVar83 * fVar35 + fVar45 * fVar79 + fVar67 * fVar66))
    ;
    auVar42._12_4_ =
         fVar51 * fVar53 +
         fVar25 * fVar74 + (fVar26 * fVar54 - (fVar83 * fVar53 + fVar45 * fVar74 + fVar67 * fVar54))
    ;
    aVar43 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
             insertps(auVar42,(ray->org).field_0.m128[3],0x30);
    (ray->org).field_0 = aVar43;
    auVar24._0_4_ = fVar29 * fVar77 + fVar52 * fVar61 + fVar63 * fVar69;
    auVar24._4_4_ = fVar29 * fVar34 + fVar52 * fVar62 + fVar63 * fVar78;
    auVar24._8_4_ = fVar29 * fVar35 + fVar52 * fVar79 + fVar63 * fVar66;
    auVar24._12_4_ = fVar29 * fVar53 + fVar52 * fVar74 + fVar63 * fVar54;
    aVar43 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
             insertps(auVar24,(ray->dir).field_0.m128[3],0x30);
    (ray->dir).field_0 = aVar43;
    (**(code **)(p_Var18 + 0x80))(p_Var18 + 0x58,ray);
    local_188 = auVar46._0_8_;
    uStack_180 = aVar10._8_8_;
    *(undefined1 (*) [8])&(ray->org).field_0 = local_188;
    *(undefined8 *)((long)&(ray->org).field_0 + 8) = uStack_180;
    local_198 = auVar55._0_8_;
    uStack_190 = aVar11._8_8_;
    *(undefined1 (*) [8])&(ray->dir).field_0 = local_198;
    *(undefined8 *)((long)&(ray->dir).field_0 + 8) = uStack_190;
    bVar12 = ray->tfar <= 0.0 && ray->tfar != 0.0;
    pRVar6->instID[0] = 0xffffffff;
    pRVar6->instPrimID[0] = 0xffffffff;
  }
  return bVar12;
}

Assistant:

bool InstanceArrayIntersector1MB::occluded(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
    {
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return false;

      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      if ((ray.mask & instance->mask) == 0) 
        return false;
#endif
      
      RTCRayQueryContext* user_context = context->user;
      bool occluded = false;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        const AffineSpace3fa world2local = instance->getWorld2Local(prim.primID_, ray.time());
        const Vec3ff ray_org = ray.org;
        const Vec3ff ray_dir = ray.dir;
        ray.org = Vec3ff(xfmPoint(world2local, ray_org), ray.tnear());
        ray.dir = Vec3ff(xfmVector(world2local, ray_dir), ray.time());
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.occluded((RTCRay&)ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        occluded = ray.tfar < 0.0f;
        instance_id_stack::pop(user_context);      
      }
      return occluded;
    }